

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O1

void __thiscall
btConvexConvexAlgorithm::processCollision::btWithoutMarginResult::addContactPoint
          (btWithoutMarginResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorldOrg,
          btScalar depthOrg)

{
  undefined8 uVar1;
  float fVar2;
  btVector3 adjustedPointB;
  undefined1 local_10 [16];
  
  this->m_reportedDistance = depthOrg;
  uVar1 = *(undefined8 *)(normalOnBInWorld->m_floats + 2);
  *(undefined8 *)(this->m_reportedNormalOnWorld).m_floats =
       *(undefined8 *)normalOnBInWorld->m_floats;
  *(undefined8 *)((this->m_reportedNormalOnWorld).m_floats + 2) = uVar1;
  fVar2 = this->m_marginOnB;
  local_10._4_4_ =
       (float)((ulong)*(undefined8 *)pointInWorldOrg->m_floats >> 0x20) -
       fVar2 * (float)((ulong)*(undefined8 *)normalOnBInWorld->m_floats >> 0x20);
  local_10._0_4_ =
       (float)*(undefined8 *)pointInWorldOrg->m_floats -
       fVar2 * (float)*(undefined8 *)normalOnBInWorld->m_floats;
  local_10._8_4_ = pointInWorldOrg->m_floats[2] - normalOnBInWorld->m_floats[2] * fVar2;
  local_10._12_4_ = 0;
  fVar2 = fVar2 + this->m_marginOnA + depthOrg;
  this->m_reportedDistance = fVar2;
  if (fVar2 < 0.0) {
    this->m_foundResult = true;
  }
  (*this->m_originalResult->_vptr_Result[4])(this->m_originalResult,normalOnBInWorld,local_10);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorldOrg,btScalar depthOrg) 
			{
				m_reportedDistance = depthOrg;
				m_reportedNormalOnWorld = normalOnBInWorld;
				
				btVector3 adjustedPointB = pointInWorldOrg - normalOnBInWorld*m_marginOnB;
				m_reportedDistance = depthOrg+(m_marginOnA+m_marginOnB);
				if (m_reportedDistance<0.f)
				{
					m_foundResult = true;					
				}
				m_originalResult->addContactPoint(normalOnBInWorld,adjustedPointB,m_reportedDistance);
			}